

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O3

Vec_Int_t *
Gia_PolynCoreOrder_int
          (Gia_Man_t *pGia,Vec_Int_t *vAdds,Vec_Wec_t *vMap,Vec_Int_t *vRoots,Vec_Int_t **pvIns)

{
  long lVar1;
  uint *puVar2;
  uint uVar3;
  uint Entry;
  byte bVar4;
  int iVar5;
  Vec_Int_t *p;
  int *piVar6;
  void *__s;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  size_t __size;
  int iVar10;
  int Entry_00;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p->pArray = piVar6;
  iVar10 = ((pGia->nObjs >> 5) + 1) - (uint)((pGia->nObjs & 0x1fU) == 0);
  if (iVar10 == 0) {
    __size = 0;
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar10 << 2;
    __s = malloc(__size);
  }
  uVar15 = iVar10 * 0x20;
  memset(__s,0,__size);
  uVar7 = (ulong)vRoots->nSize;
  if (0 < (long)uVar7) {
    piVar6 = vRoots->pArray;
    uVar11 = 0;
    do {
      uVar9 = piVar6[uVar11];
      if (((int)uVar9 < 0) || ((int)uVar15 <= (int)uVar9)) goto LAB_0066d3ba;
      puVar2 = (uint *)((long)__s + (ulong)(uVar9 >> 5) * 4);
      *puVar2 = *puVar2 | 1 << ((byte)uVar9 & 0x1f);
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
  }
  Entry_00 = -1;
  uVar9 = 0xffffffff;
  do {
    if ((int)uVar7 < 1) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      while( true ) {
        uVar3 = vRoots->pArray[uVar11];
        if (((int)uVar3 < 0) || (vMap->nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        iVar5 = vMap->pArray[uVar3].nSize;
        iVar12 = 0;
        if (1 < iVar5) {
          piVar6 = vMap->pArray[uVar3].pArray;
          lVar1 = 1;
          do {
            lVar13 = lVar1;
            uVar9 = piVar6[lVar13];
            if (((int)uVar9 < 0) || ((int)uVar15 <= (int)uVar9)) goto LAB_0066d37c;
            lVar1 = lVar13;
          } while (((*(uint *)((long)__s + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) & 1) == 0) &&
                  (lVar1 = lVar13 + 2, (int)lVar1 < iVar5));
          iVar12 = (int)lVar1 + -1;
          Entry_00 = piVar6[(int)lVar13 - 1U & 0xfffffffe];
        }
        if (iVar12 != iVar5) break;
        uVar11 = uVar11 + 1;
        if (uVar11 == (uVar7 & 0xffffffff)) goto LAB_0066d2e0;
      }
      if ((int)uVar15 <= (int)uVar3) {
LAB_0066d37c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if ((*(uint *)((long)__s + (ulong)(uVar3 >> 5) * 4) >> (uVar3 & 0x1f) & 1) == 0) {
        __assert_fail("Vec_BitEntry(vIsRoot, Entry1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                      ,0x80,
                      "Vec_Int_t *Gia_PolynCoreOrder_int(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t **)"
                     );
      }
      if (((int)uVar9 < 0) || ((int)uVar15 <= (int)uVar9)) goto LAB_0066d37c;
      if ((*(uint *)((long)__s + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) & 1) == 0) {
        __assert_fail("Vec_BitEntry(vIsRoot, Entry2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                      ,0x81,
                      "Vec_Int_t *Gia_PolynCoreOrder_int(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t **)"
                     );
      }
      Vec_IntPush(p,Entry_00);
      puVar2 = (uint *)((long)__s + (ulong)(uVar3 >> 5) * 4);
      *puVar2 = *puVar2 & ~(1 << ((byte)uVar3 & 0x1f));
      puVar2 = (uint *)((long)__s + (ulong)(uVar9 >> 5) * 4);
      *puVar2 = *puVar2 & ~(1 << ((byte)uVar9 & 0x1f));
      iVar5 = vRoots->nSize;
      uVar7 = (ulong)iVar5;
      if ((long)uVar7 < 1) {
        if (iVar5 != 0) {
LAB_0066d436:
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
        uVar7 = 0;
      }
      else {
        piVar6 = vRoots->pArray;
        uVar14 = 1;
LAB_0066d0e0:
        if (piVar6[uVar14 - 1] != uVar3) goto code_r0x0066d0e7;
        if ((int)uVar14 < iVar5) {
          do {
            piVar6[uVar14 - 1] = piVar6[uVar14];
            uVar14 = uVar14 + 1;
            iVar5 = vRoots->nSize;
          } while ((int)uVar14 < iVar5);
        }
        uVar7 = (ulong)(iVar5 - 1U);
        vRoots->nSize = iVar5 - 1U;
LAB_0066d12d:
        iVar5 = (int)uVar7;
        if (iVar5 < 1) {
          if (iVar5 != 0) goto LAB_0066d436;
          uVar7 = 0;
        }
        else {
          uVar14 = 1;
          do {
            if (piVar6[uVar14 - 1] == uVar9) {
              if ((int)uVar14 < iVar5) {
                do {
                  piVar6[uVar14 - 1] = piVar6[uVar14];
                  uVar14 = uVar14 + 1;
                  iVar5 = vRoots->nSize;
                } while ((int)uVar14 < iVar5);
              }
              uVar7 = (ulong)(iVar5 - 1U);
              vRoots->nSize = iVar5 - 1U;
              break;
            }
            bVar16 = uVar14 != (uVar7 & 0xffffffff);
            uVar14 = uVar14 + 1;
          } while (bVar16);
        }
      }
      if (Entry_00 < 0) {
LAB_0066d3d9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar3 = Entry_00 * 6;
      uVar9 = vAdds->nSize;
      if ((((int)uVar9 <= (int)uVar3) || (uVar9 <= (uVar3 | 1))) || (uVar9 <= uVar3 + 2))
      goto LAB_0066d3d9;
      piVar6 = vAdds->pArray;
      Entry = piVar6[uVar3];
      if (((int)Entry < 0) || ((int)uVar15 <= (int)Entry)) {
LAB_0066d3ba:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      uVar9 = piVar6[uVar3 | 1];
      bVar4 = (byte)Entry & 0x1f;
      uVar3 = piVar6[uVar3 + 2];
      puVar2 = (uint *)((long)__s + (ulong)(Entry >> 5) * 4);
      *puVar2 = *puVar2 | 1 << bVar4;
      if ((((int)uVar9 < 0) ||
          ((uVar15 <= uVar9 ||
           (puVar2 = (uint *)((long)__s + (ulong)(uVar9 >> 5) * 4),
           *puVar2 = *puVar2 | 1 << ((byte)uVar9 & 0x1f), (int)uVar3 < 0)))) || (uVar15 <= uVar3))
      goto LAB_0066d3ba;
      puVar2 = (uint *)((long)__s + (ulong)(uVar3 >> 5) * 4);
      *puVar2 = *puVar2 | 1 << ((byte)uVar3 & 0x1f);
      if (0 < (int)uVar7) {
        uVar14 = (ulong)(uint)(0 << bVar4);
        do {
          if (vRoots->pArray[uVar14] == Entry) goto LAB_0066d271;
          uVar14 = uVar14 + 1;
        } while ((uVar7 & 0xffffffff) != uVar14);
      }
      Vec_IntPush(vRoots,Entry);
      uVar7 = (ulong)(uint)vRoots->nSize;
LAB_0066d271:
      if (0 < (int)uVar7) {
        uVar14 = 0;
        do {
          if (vRoots->pArray[uVar14] == uVar9) goto LAB_0066d2a4;
          uVar14 = uVar14 + 1;
        } while ((uVar7 & 0xffffffff) != uVar14);
      }
      Vec_IntPush(vRoots,uVar9);
      uVar7 = (ulong)(uint)vRoots->nSize;
LAB_0066d2a4:
      if (0 < (int)uVar7) {
        uVar14 = 0;
        do {
          if (vRoots->pArray[uVar14] == uVar3) goto LAB_0066d2d8;
          uVar14 = uVar14 + 1;
        } while ((uVar7 & 0xffffffff) != uVar14);
      }
      Vec_IntPush(vRoots,uVar3);
      uVar7 = (ulong)(uint)vRoots->nSize;
    }
LAB_0066d2d8:
  } while ((int)uVar11 != (int)uVar7);
LAB_0066d2e0:
  if (pvIns != (Vec_Int_t **)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nSize = 0;
    pVVar8->nCap = uVar15;
    if (iVar10 == 0) {
      pVVar8->pArray = (int *)0x0;
      *pvIns = pVVar8;
    }
    else {
      piVar6 = (int *)malloc((long)(int)uVar15 << 2);
      pVVar8->pArray = piVar6;
      *pvIns = pVVar8;
      if (0 < iVar10) {
        uVar9 = 2;
        if (2 < (int)uVar15) {
          uVar9 = uVar15;
        }
        uVar15 = 1;
        do {
          if ((*(uint *)((long)__s + (ulong)(uVar15 >> 5) * 4) >> (uVar15 & 0x1f) & 1) != 0) {
            Vec_IntPush(*pvIns,uVar15);
          }
          uVar15 = uVar15 + 1;
        } while (uVar9 != uVar15);
        goto LAB_0066d360;
      }
    }
  }
  if (__s == (void *)0x0) {
    return p;
  }
LAB_0066d360:
  free(__s);
  return p;
code_r0x0066d0e7:
  bVar16 = uVar14 == uVar7;
  uVar14 = uVar14 + 1;
  if (bVar16) goto LAB_0066d12d;
  goto LAB_0066d0e0;
}

Assistant:

Vec_Int_t * Gia_PolynCoreOrder_int( Gia_Man_t * pGia, Vec_Int_t * vAdds, Vec_Wec_t * vMap, Vec_Int_t * vRoots, Vec_Int_t ** pvIns )
{
    Vec_Int_t * vOrder  = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, k, Index = -1, Driver, Entry1, Entry2 = -1;
    // mark roots
    Vec_IntForEachEntry( vRoots, Driver, i )
        Vec_BitWriteEntry( vIsRoot, Driver, 1 );
    // collect boxes
    while ( 1 )
    {
        // iterate through boxes driving this one
        Vec_IntForEachEntry( vRoots, Entry1, i )
        {
            Vec_Int_t * vLevel = Vec_WecEntry( vMap, Entry1 );
            Vec_IntForEachEntryDouble( vLevel, Index, Entry2, k )
                if ( Vec_BitEntry(vIsRoot, Entry2) )
                    break;
            if ( k == Vec_IntSize(vLevel) )
                continue;
            assert( Vec_BitEntry(vIsRoot, Entry1) );
            assert( Vec_BitEntry(vIsRoot, Entry2) );
            // collect adder
            Vec_IntPush( vOrder, Index );
            // clean marks
            Vec_BitWriteEntry( vIsRoot, Entry1, 0 );
            Vec_BitWriteEntry( vIsRoot, Entry2, 0 );
            Vec_IntRemove( vRoots, Entry1 );
            Vec_IntRemove( vRoots, Entry2 );
            // set new marks
            Entry1 = Vec_IntEntry( vAdds, 6*Index + 0 );
            Entry2 = Vec_IntEntry( vAdds, 6*Index + 1 );
            Driver = Vec_IntEntry( vAdds, 6*Index + 2 );
            Vec_BitWriteEntry( vIsRoot, Entry1, 1 );
            Vec_BitWriteEntry( vIsRoot, Entry2, 1 );
            Vec_BitWriteEntry( vIsRoot, Driver, 1 );
            Vec_IntPushUnique( vRoots, Entry1 );
            Vec_IntPushUnique( vRoots, Entry2 );
            Vec_IntPushUnique( vRoots, Driver );
            break;
        }
        if ( i == Vec_IntSize(vRoots) )
            break;
    }
    // collect remaining leaves
    if ( pvIns )
    {
        *pvIns = Vec_IntAlloc( Vec_BitSize(vIsRoot) );
        Vec_BitForEachEntryStart( vIsRoot, Driver, i, 1 )
            if ( Driver )
                Vec_IntPush( *pvIns, i );
    }
    Vec_BitFree( vIsRoot );
    return vOrder;
}